

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock_main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int local_14;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running main() from gmock_main.cc\n",0x22);
  testing::InitGoogleMock(&local_14,argv);
  testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run();
  return iVar1;
}

Assistant:

GTEST_API_ int main(int argc, char** argv) {
#endif  // GTEST_OS_WINDOWS_MOBILE
  std::cout << "Running main() from gmock_main.cc\n";
  // Since Google Mock depends on Google Test, InitGoogleMock() is
  // also responsible for initializing Google Test.  Therefore there's
  // no need for calling testing::InitGoogleTest() separately.
  testing::InitGoogleMock(&argc, argv);
  return RUN_ALL_TESTS();
}